

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O3

int ReadPNM(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint64_t uVar16;
  uint8_t *puVar17;
  uint uVar18;
  char *__format;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint8_t *puVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  char out_1 [1025];
  char out [1025];
  int local_8ec;
  undefined4 local_8e4;
  WebPPicture *local_8e0;
  uint8_t *local_8d8;
  ulong local_8d0;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  uint local_8b0;
  size_t local_8a8;
  uint8_t *local_8a0;
  uint8_t *local_898;
  ulong local_890;
  undefined1 local_888 [16];
  uint64_t local_878;
  ulong local_870;
  uint8_t *local_868;
  size_t local_860;
  long local_858;
  long local_850;
  uint8_t local_848 [4];
  char cStack_844;
  char cStack_843;
  char cStack_842;
  char cStack_841;
  char cStack_840;
  char cStack_83f;
  char cStack_83e;
  char cStack_83d;
  char cStack_83c;
  char cStack_83b;
  char cStack_83a;
  char cStack_839;
  char cStack_838;
  char cStack_837;
  char cStack_836;
  char cStack_835;
  char cStack_834;
  char cStack_833;
  char cStack_832;
  char cStack_831;
  char cStack_830;
  uint8_t local_438 [1032];
  
  local_890 = CONCAT44(local_890._4_4_,keep_alpha);
  local_8d8 = data;
  local_8d0 = data_size;
  local_8a8 = data_size;
  local_898 = data;
  if ((data != (uint8_t *)0x0) && (2 < data_size)) {
    local_8b0 = 0;
    local_8c8 = (undefined1  [16])0x0;
    local_8b8 = 0xffffffff00000000;
    uVar23 = 1;
    uVar8 = 0;
    do {
      uVar5 = data[uVar23 - 1];
      local_438[uVar8] = uVar5;
      uVar24 = uVar8;
      if ((uVar5 == '\n') ||
         (uVar24 = uVar8 + 1, bVar25 = 0x3fe < uVar8, uVar8 = uVar24, data_size <= uVar23 || bVar25)
         ) {
        if (data_size <= uVar23) goto LAB_00109232;
        if (uVar24 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          if (local_438[0] != '#') goto LAB_00109232;
        }
      }
      uVar23 = uVar23 + 1;
    } while( true );
  }
LAB_00109a8d:
  ReadPNM_cold_7();
LAB_00109a95:
  puVar9 = (uint8_t *)0x0;
  uVar19 = 0;
LAB_00109a97:
  free(puVar9);
  return uVar19;
LAB_00109232:
  local_438[uVar24] = '\0';
  iVar6 = __isoc99_sscanf(local_438);
  if (iVar6 == 1) {
    if (local_8b8._4_4_ == 7) {
      local_8ec = -1;
      local_888._8_8_ = 0x4143535941524720;
      local_888._0_8_ = 0x455059544c505554;
      local_8e0 = pic;
LAB_001092c1:
      uVar24 = uVar23;
      if (uVar24 < local_8d0) goto code_r0x001092c9;
      local_848[0] = '\0';
      goto LAB_00109341;
    }
    do {
      uVar8 = uVar23;
      if (local_8d0 <= uVar23) {
        uVar24 = 0;
        break;
      }
      uVar24 = 0;
      do {
        uVar14 = uVar24;
        uVar8 = uVar8 + 1;
        uVar5 = local_8d8[uVar14 + uVar23];
        local_438[uVar14] = uVar5;
        uVar24 = uVar14;
        if ((uVar5 == '\n') || (uVar24 = uVar14 + 1, 0x3fe < uVar14)) break;
      } while (uVar23 + 1 + uVar14 < local_8d0);
      uVar21 = uVar23 + uVar14 + 1;
      if (local_8d0 <= uVar21) {
        uVar8 = uVar23 + uVar14 + 1;
        break;
      }
      uVar23 = uVar21;
    } while ((uVar24 == 0) || (local_438[0] == '#'));
    local_438[uVar24] = '\0';
    iVar6 = __isoc99_sscanf(local_438,"%d %d",local_8c8,local_8c8 + 4);
    if (iVar6 == 2) {
      do {
        uVar24 = uVar8;
        if (local_8d0 <= uVar8) {
          uVar23 = 0;
          break;
        }
        uVar23 = 0;
        do {
          uVar14 = uVar23;
          uVar24 = uVar24 + 1;
          uVar5 = local_8d8[uVar14 + uVar8];
          local_438[uVar14] = uVar5;
          uVar23 = uVar14;
          if ((uVar5 == '\n') || (uVar23 = uVar14 + 1, 0x3fe < uVar14)) break;
        } while (uVar8 + 1 + uVar14 < local_8d0);
        uVar21 = uVar14 + uVar8 + 1;
        if (local_8d0 <= uVar21) {
          uVar24 = uVar14 + uVar8 + 1;
          break;
        }
        uVar8 = uVar21;
      } while ((uVar23 == 0) || (local_438[0] == '#'));
      local_438[uVar23] = '\0';
      iVar6 = __isoc99_sscanf(local_438,"%d",&local_8b8);
      if (iVar6 == 1) {
        local_8c8._12_4_ = (uint)(local_8b8._4_4_ != 5) * 2 + 1;
        goto LAB_0010971c;
      }
    }
  }
  goto LAB_00109a8d;
code_r0x001092c9:
  uVar8 = 0;
  do {
    uVar14 = uVar8;
    uVar5 = local_8d8[uVar14 + uVar24];
    local_848[uVar14] = uVar5;
    uVar8 = uVar14;
    if ((uVar5 == '\n') || (uVar8 = uVar14 + 1, 0x3fe < uVar14)) break;
  } while (uVar24 + 1 + uVar14 < local_8d0);
  uVar23 = uVar24 + uVar14 + 1;
  if ((uVar23 < local_8d0) && ((uVar8 == 0 || (local_848[0] == '#')))) goto LAB_001092c1;
  local_848[uVar8] = '\0';
  uVar24 = uVar24 + uVar14 + 1;
LAB_00109341:
  iVar6 = __isoc99_sscanf(local_848,"WIDTH %d",&local_8e4);
  uVar23 = uVar24;
  if (iVar6 != 1) {
    iVar6 = __isoc99_sscanf(local_848,"HEIGHT %d",&local_8e4);
    if (iVar6 == 1) {
      if ((local_8b0 & 2) != 0) {
        ReadPNM_cold_5();
        goto LAB_00109714;
      }
      local_8b0 = local_8b0 | 2;
      local_8c8._4_4_ = local_8e4;
    }
    else {
      iVar6 = __isoc99_sscanf(local_848,"DEPTH %d",&local_8e4);
      if (iVar6 == 1) {
        if ((local_8b0 & 4) != 0) {
          ReadPNM_cold_4();
          goto LAB_00109714;
        }
        local_8b0 = local_8b0 | 4;
        local_8c8._12_4_ = local_8e4;
      }
      else {
        iVar6 = __isoc99_sscanf(local_848,"MAXVAL %d",&local_8e4);
        pic = local_8e0;
        if (iVar6 == 1) {
          if ((local_8b0 & 8) != 0) {
            ReadPNM_cold_3();
            goto LAB_00109714;
          }
          local_8b0 = local_8b0 | 8;
          local_8b8 = CONCAT44(local_8b8._4_4_,local_8e4);
        }
        else {
          auVar30[0] = -(local_848[3] == 'L');
          auVar30[1] = -(cStack_844 == 'T');
          auVar30[2] = -(cStack_843 == 'Y');
          auVar30[3] = -(cStack_842 == 'P');
          auVar30[4] = -(cStack_841 == 'E');
          auVar30[5] = -(cStack_840 == ' ');
          auVar30[6] = -(cStack_83f == 'R');
          auVar30[7] = -(cStack_83e == 'G');
          auVar30[8] = -(cStack_83d == 'B');
          auVar30[9] = -(cStack_83c == '_');
          auVar30[10] = -(cStack_83b == 'A');
          auVar30[0xb] = -(cStack_83a == 'L');
          auVar30[0xc] = -(cStack_839 == 'P');
          auVar30[0xd] = -(cStack_838 == 'H');
          auVar30[0xe] = -(cStack_837 == 'A');
          auVar30[0xf] = -(cStack_836 == '\0');
          auVar33[0] = -(local_848[0] == 'T');
          auVar33[1] = -(local_848[1] == 'U');
          auVar33[2] = -(local_848[2] == 'P');
          auVar33[3] = -(local_848[3] == 'L');
          auVar33[4] = -(cStack_844 == 'T');
          auVar33[5] = -(cStack_843 == 'Y');
          auVar33[6] = -(cStack_842 == 'P');
          auVar33[7] = -(cStack_841 == 'E');
          auVar33[8] = -(cStack_840 == ' ');
          auVar33[9] = -(cStack_83f == 'R');
          auVar33[10] = -(cStack_83e == 'G');
          auVar33[0xb] = -(cStack_83d == 'B');
          auVar33[0xc] = -(cStack_83c == '_');
          auVar33[0xd] = -(cStack_83b == 'A');
          auVar33[0xe] = -(cStack_83a == 'L');
          auVar33[0xf] = -(cStack_839 == 'P');
          auVar33 = auVar33 & auVar30;
          if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) {
            local_8b0 = local_8b0 | 0x10;
            local_8ec = 4;
          }
          else if (CONCAT17(cStack_83c,
                            CONCAT16(cStack_83d,
                                     CONCAT15(cStack_83e,
                                              CONCAT14(cStack_83f,
                                                       CONCAT13(cStack_840,
                                                                CONCAT12(cStack_841,
                                                                         CONCAT11(cStack_842,
                                                                                  cStack_843)))))))
                   == 0x42475220455059 &&
                   CONCAT17(cStack_841,
                            CONCAT16(cStack_842,
                                     CONCAT15(cStack_843,
                                              CONCAT14(cStack_844,
                                                       CONCAT13(local_848[3],
                                                                CONCAT12(local_848[2],
                                                                         CONCAT11(local_848[1],
                                                                                  local_848[0]))))))
                           ) == 0x455059544c505554) {
            local_8b0 = local_8b0 | 0x10;
            local_8ec = 3;
          }
          else {
            auVar31[0] = -(cStack_83f == 'G');
            auVar31[1] = -(cStack_83e == 'R');
            auVar31[2] = -(cStack_83d == 'A');
            auVar31[3] = -(cStack_83c == 'Y');
            auVar31[4] = -(cStack_83b == 'S');
            auVar31[5] = -(cStack_83a == 'C');
            auVar31[6] = -(cStack_839 == 'A');
            auVar31[7] = -(cStack_838 == 'L');
            auVar31[8] = -(cStack_837 == 'E');
            auVar31[9] = -(cStack_836 == '_');
            auVar31[10] = -(cStack_835 == 'A');
            auVar31[0xb] = -(cStack_834 == 'L');
            auVar31[0xc] = -(cStack_833 == 'P');
            auVar31[0xd] = -(cStack_832 == 'H');
            auVar31[0xe] = -(cStack_831 == 'A');
            auVar31[0xf] = -(cStack_830 == '\0');
            auVar34[0] = -(local_848[0] == local_888[0]);
            auVar34[1] = -(local_848[1] == local_888[1]);
            auVar34[2] = -(local_848[2] == local_888[2]);
            auVar34[3] = -(local_848[3] == local_888[3]);
            auVar34[4] = -(cStack_844 == local_888[4]);
            auVar34[5] = -(cStack_843 == local_888[5]);
            auVar34[6] = -(cStack_842 == local_888[6]);
            auVar34[7] = -(cStack_841 == local_888[7]);
            auVar34[8] = -(cStack_840 == local_888[8]);
            auVar34[9] = -(cStack_83f == local_888[9]);
            auVar34[10] = -(cStack_83e == local_888[10]);
            auVar34[0xb] = -(cStack_83d == local_888[0xb]);
            auVar34[0xc] = -(cStack_83c == local_888[0xc]);
            auVar34[0xd] = -(cStack_83b == local_888[0xd]);
            auVar34[0xe] = -(cStack_83a == local_888[0xe]);
            auVar34[0xf] = -(cStack_839 == local_888[0xf]);
            auVar34 = auVar34 & auVar31;
            if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
              local_8b0 = local_8b0 | 0x10;
              local_8ec = 2;
            }
            else {
              auVar32[0] = -(local_848[3] == 'L');
              auVar32[1] = -(cStack_844 == 'T');
              auVar32[2] = -(cStack_843 == 'Y');
              auVar32[3] = -(cStack_842 == 'P');
              auVar32[4] = -(cStack_841 == 'E');
              auVar32[5] = -(cStack_840 == ' ');
              auVar32[6] = -(cStack_83f == 'G');
              auVar32[7] = -(cStack_83e == 'R');
              auVar32[8] = -(cStack_83d == 'A');
              auVar32[9] = -(cStack_83c == 'Y');
              auVar32[10] = -(cStack_83b == 'S');
              auVar32[0xb] = -(cStack_83a == 'C');
              auVar32[0xc] = -(cStack_839 == 'A');
              auVar32[0xd] = -(cStack_838 == 'L');
              auVar32[0xe] = -(cStack_837 == 'E');
              auVar32[0xf] = -(cStack_836 == '\0');
              auVar35[0] = -(local_848[0] == local_888[0]);
              auVar35[1] = -(local_848[1] == local_888[1]);
              auVar35[2] = -(local_848[2] == local_888[2]);
              auVar35[3] = -(local_848[3] == local_888[3]);
              auVar35[4] = -(cStack_844 == local_888[4]);
              auVar35[5] = -(cStack_843 == local_888[5]);
              auVar35[6] = -(cStack_842 == local_888[6]);
              auVar35[7] = -(cStack_841 == local_888[7]);
              auVar35[8] = -(cStack_840 == local_888[8]);
              auVar35[9] = -(cStack_83f == local_888[9]);
              auVar35[10] = -(cStack_83e == local_888[10]);
              auVar35[0xb] = -(cStack_83d == local_888[0xb]);
              auVar35[0xc] = -(cStack_83c == local_888[0xc]);
              auVar35[0xd] = -(cStack_83b == local_888[0xd]);
              auVar35[0xe] = -(cStack_83a == local_888[0xe]);
              auVar35[0xf] = -(cStack_839 == local_888[0xf]);
              auVar35 = auVar35 & auVar32;
              if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) {
                if (CONCAT13(cStack_842,CONCAT12(cStack_843,CONCAT11(cStack_844,local_848[3]))) !=
                    0x524448 ||
                    CONCAT13(local_848[3],CONCAT12(local_848[2],CONCAT11(local_848[1],local_848[0]))
                            ) != 0x48444e45) {
                  ReadPNM_cold_1();
                  goto LAB_00109714;
                }
                if ((local_8b0 & 0xf) == 0) {
                  ReadPNM_cold_2();
                  uVar24 = 0;
                }
                else if ((local_8ec != -1) && (local_8c8._12_4_ != local_8ec)) {
                  uVar24 = 0;
                  fprintf(_stderr,"PAM header error: expected DEPTH %d but got DEPTH %d\n");
                }
                goto LAB_0010971c;
              }
              local_8b0 = local_8b0 | 0x10;
              local_8ec = 1;
            }
          }
        }
      }
    }
    goto LAB_001092c1;
  }
  if ((local_8b0 & 1) == 0) {
    local_8b0 = local_8b0 | 1;
    local_8c8._0_4_ = local_8e4;
    goto LAB_001092c1;
  }
  ReadPNM_cold_6();
LAB_00109714:
  uVar24 = 0;
  pic = local_8e0;
LAB_0010971c:
  uVar2 = local_8c8._0_4_;
  lVar15 = (long)(int)local_8c8._0_4_;
  if (lVar15 < 1) goto LAB_00109a8d;
  uVar3 = local_8c8._4_4_;
  uVar8 = (ulong)(uint)local_8c8._4_4_;
  if ((int)local_8c8._4_4_ < 1) goto LAB_00109a8d;
  if ((local_8b8._4_4_ - 9 < 0xfffffff8) || (local_8c8._12_4_ - 5 < 0xfffffffc)) goto LAB_00109a8d;
  if ((uint)local_8b8 - 0x10000 < 0xffff0001) goto LAB_00109a8d;
  uVar19 = local_8c8._12_4_ << (0xff < (uint)local_8b8);
  local_8c8._8_4_ = uVar19;
  if (uVar24 == 0) goto LAB_00109a8d;
  if (local_8b8._4_4_ - 8 < 0xfffffffd) {
    __format = "Unsupported P%d PNM format.\n";
LAB_00109b0f:
    fprintf(_stderr,__format,(ulong)local_8b8._4_4_);
  }
  else if (pic != (WebPPicture *)0x0) {
    if (((uint)uVar2 < 0x4000) && ((uint)uVar3 < 0x4000)) {
      if (local_8a8 < (ulong)uVar19 * uVar8 * lVar15 + uVar24) {
        __format = "Truncated PNM file (P%d).\n";
        goto LAB_00109b0f;
      }
      bVar25 = (local_8c8._12_4_ & 5) != 1;
      iVar6 = (int)local_890;
      bVar26 = (int)local_890 != 0;
      uVar16 = ((ulong)(bVar26 && bVar25) + 3) * lVar15;
      local_870 = local_8b8 & 0xffffffff;
      iVar7 = ImgIoUtilCheckSizeArgumentsOverflow(uVar16,uVar8);
      if (iVar7 != 0) {
        uVar19 = local_8c8._4_4_;
        lVar15 = (long)(int)local_8c8._4_4_;
        local_878 = uVar16;
        puVar9 = (uint8_t *)malloc(uVar16 * lVar15);
        auVar30 = local_888;
        if (puVar9 != (uint8_t *)0x0) {
          local_888._4_4_ = 0;
          local_888._0_4_ = local_8c8._0_4_;
          local_888._8_8_ = auVar30._8_8_;
          uVar16 = local_878;
          local_8e0 = pic;
          local_8a0 = puVar9;
          if (0 < (int)uVar19) {
            local_850 = (long)(int)(local_8c8._8_4_ * local_8c8._0_4_);
            uVar2 = local_8c8._12_4_;
            uVar4 = (uint)local_8b8;
            bVar27 = (uint)local_8b8 != 0xff;
            bVar28 = local_8c8._12_4_ == 3;
            bVar1 = (int)local_8c8._12_4_ < 3;
            iVar7 = (int)(uint)local_8b8 / 2;
            uVar18 = local_8c8._12_4_ * local_8c8._0_4_;
            bVar29 = local_8c8._12_4_ == 2;
            local_8a8 = CONCAT71(local_8a8._1_7_,local_8c8._12_4_ == 4 && iVar6 == 0);
            local_860 = (size_t)(int)uVar18;
            puVar17 = local_898 + uVar24;
            local_868 = puVar9 + 2;
            uVar23 = 0;
            puVar22 = local_898;
            uVar8 = local_870;
            local_858 = lVar15;
            do {
              local_890 = uVar23;
              if (bVar1 || bVar27) {
                if (0 < (int)uVar18) {
                  uVar23 = 0;
                  iVar20 = 0;
                  do {
                    if ((uint)uVar8 < 0x100) {
                      uVar19 = (uint)puVar17[uVar23];
                    }
                    else {
                      uVar19 = (uint)(ushort)(*(ushort *)(puVar17 + uVar23 * 2) << 8 |
                                             *(ushort *)(puVar17 + uVar23 * 2) >> 8);
                    }
                    if (uVar4 != 0xff) {
                      uVar19 = (uVar19 * 0xff + iVar7) / uVar4;
                    }
                    if (0xfe < uVar19) {
                      uVar19 = 0xff;
                    }
                    uVar5 = (uint8_t)uVar19;
                    if ((int)uVar2 < 3) {
                      if ((uVar2 != 1 & (byte)uVar23) == 0) {
                        puVar9[(long)iVar20 + 2] = uVar5;
                        puVar9[(long)iVar20 + 1] = uVar5;
                        iVar11 = 3;
                        goto LAB_001099f0;
                      }
                      if (bVar29 && iVar6 != 0) goto LAB_001099eb;
                    }
                    else if (((byte)local_8a8 & (~(uint)uVar23 & 3) == 0) == 0) {
LAB_001099eb:
                      iVar11 = 1;
LAB_001099f0:
                      puVar9[iVar20] = uVar5;
                      iVar20 = iVar20 + iVar11;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar18 != uVar23);
                }
              }
              else if (bVar28 || iVar6 != 0) {
                memcpy(puVar9,puVar22 + uVar24,local_860);
                puVar22 = local_898;
                uVar8 = local_870;
                uVar16 = local_878;
                lVar15 = local_858;
              }
              else if (0 < (int)local_888._0_4_) {
                lVar13 = 0;
                puVar10 = local_868;
                do {
                  puVar10[-2] = puVar17[lVar13 * 4];
                  puVar10[-1] = puVar17[lVar13 * 4 + 1];
                  *puVar10 = puVar17[lVar13 * 4 + 2];
                  lVar13 = lVar13 + 1;
                  puVar10 = puVar10 + 3;
                } while (local_888._0_8_ != lVar13);
              }
              uVar24 = uVar24 + local_850;
              puVar9 = puVar9 + uVar16;
              uVar12 = (int)local_890 + 1;
              uVar23 = (ulong)uVar12;
              puVar17 = puVar17 + local_850;
              local_868 = local_868 + uVar16;
              uVar19 = (uint)lVar15;
            } while (uVar12 != uVar19);
          }
          puVar9 = local_8a0;
          local_8e0->width = local_888._0_4_;
          local_8e0->height = uVar19;
          if (bVar26 && bVar25) {
            iVar6 = WebPPictureImportRGBA(local_8e0,local_8a0,(int)uVar16);
          }
          else {
            iVar6 = WebPPictureImportRGB(local_8e0,local_8a0,(int)uVar16);
          }
          uVar19 = (uint)(iVar6 != 0);
          goto LAB_00109a97;
        }
      }
    }
    else {
      fprintf(_stderr,"Invalid %dx%d dimension for PNM\n",lVar15,(ulong)(uint)uVar3);
    }
  }
  goto LAB_00109a95;
}

Assistant:

int ReadPNM(const uint8_t* const data, size_t data_size,
            WebPPicture* const pic, int keep_alpha,
            struct Metadata* const metadata) {
  int ok = 0;
  int i, j;
  uint64_t stride, pixel_bytes, sample_size, depth;
  uint8_t* rgb = NULL, *tmp_rgb;
  size_t offset;
  PNMInfo info;

  info.data = data;
  info.data_size = data_size;
  offset = ReadHeader(&info);
  if (offset == 0) {
    fprintf(stderr, "Error parsing PNM header.\n");
    goto End;
  }

  if (info.type < 5 || info.type > 7) {
    fprintf(stderr, "Unsupported P%d PNM format.\n", info.type);
    goto End;
  }

  // Some basic validations.
  if (pic == NULL) goto End;
  if (info.width > WEBP_MAX_DIMENSION || info.height > WEBP_MAX_DIMENSION) {
    fprintf(stderr, "Invalid %dx%d dimension for PNM\n",
                    info.width, info.height);
    goto End;
  }

  pixel_bytes = (uint64_t)info.width * info.height * info.bytes_per_px;
  if (data_size < offset + pixel_bytes) {
    fprintf(stderr, "Truncated PNM file (P%d).\n", info.type);
    goto End;
  }
  sample_size = (info.max_value > 255) ? 2 : 1;
  // final depth
  depth = (info.depth == 1 || info.depth == 3 || !keep_alpha) ? 3 : 4;
  stride = depth * info.width;
  if (stride != (size_t)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, info.height)) {
    goto End;
  }

  rgb = (uint8_t*)malloc((size_t)stride * info.height);
  if (rgb == NULL) goto End;

  // Convert input.
  // We only optimize for the sample_size=1, max_value=255, depth=1 case.
  tmp_rgb = rgb;
  for (j = 0; j < info.height; ++j) {
    const uint8_t* in = data + offset;
    offset += info.bytes_per_px * info.width;
    assert(offset <= data_size);
    if (info.max_value == 255 && info.depth >= 3) {
      // RGB or RGBA
      if (info.depth == 3 || keep_alpha) {
        memcpy(tmp_rgb, in, info.depth * info.width * sizeof(*in));
      } else {
        assert(info.depth == 4 && !keep_alpha);
        for (i = 0; i < info.width; ++i) {
          tmp_rgb[3 * i + 0] = in[4 * i + 0];
          tmp_rgb[3 * i + 1] = in[4 * i + 1];
          tmp_rgb[3 * i + 2] = in[4 * i + 2];
        }
      }
    } else {
      // Unoptimized case, we need to handle non-trivial operations:
      //   * convert 16b to 8b (if max_value > 255)
      //   * rescale to [0..255] range (if max_value != 255)
      //   * drop the alpha channel (if keep_alpha is false)
      const uint32_t round = info.max_value / 2;
      int k = 0;
      for (i = 0; i < info.width * info.depth; ++i) {
        uint32_t v = (sample_size == 2) ? 256u * in[2 * i + 0] + in[2 * i + 1]
                   : in[i];
        if (info.max_value != 255) v = (v * 255u + round) / info.max_value;
        if (v > 255u) v = 255u;
        if (info.depth > 2) {
          if (!keep_alpha && info.depth == 4 && (i % 4) == 3) {
            // skip alpha
          } else {
            tmp_rgb[k] = v;
            k += 1;
          }
        } else if (info.depth == 1 || (i % 2) == 0) {
          tmp_rgb[k + 0] = tmp_rgb[k + 1] = tmp_rgb[k + 2] = v;
          k += 3;
        } else if (keep_alpha && info.depth == 2) {
          tmp_rgb[k] = v;
          k += 1;
        } else {
          // skip alpha
        }
      }
    }
    tmp_rgb += stride;
  }

  // WebP conversion.
  pic->width = info.width;
  pic->height = info.height;
  ok = (depth == 4) ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                    : WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) goto End;

  ok = 1;
 End:
  free((void*)rgb);

  (void)metadata;
  (void)keep_alpha;
  return ok;
}